

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O2

int VP8LColorSpaceTransform
              (int width,int height,int bits,int quality,uint32_t *argb,uint32_t *image,
              WebPPicture *pic,int percent_range,int *percent,int *best_bits)

{
  int *piVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int64_t iVar7;
  int64_t iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint red_to_blue;
  int iVar14;
  undefined4 in_register_00000034;
  uint uVar15;
  VP8LMultipliers prev_x;
  ulong uVar16;
  VP8LMultipliers prev_y;
  uint32_t *puVar17;
  long lVar18;
  uint uVar19;
  VP8LMultipliers local_91c;
  ulong local_918;
  uint local_910;
  uint local_90c;
  uint local_908;
  int local_904;
  uint32_t *local_900;
  ulong local_8f8;
  uint32_t *local_8f0;
  uint local_8e4;
  int local_8e0;
  int local_8dc;
  int local_8d8;
  int local_8d4;
  undefined8 local_8d0;
  long local_8c8;
  ulong local_8c0;
  uint32_t *local_8b8;
  uint32_t *local_8b0;
  long local_8a8;
  ulong local_8a0;
  ulong local_898;
  uint32_t *local_890;
  long local_888;
  long local_880;
  ulong local_878;
  long local_870;
  ulong local_868;
  ulong local_860;
  long local_858;
  long local_850;
  long local_848;
  long local_840;
  uint32_t accumulated_blue_histo [256];
  uint32_t accumulated_red_histo [256];
  
  local_8d0 = CONCAT44(in_register_00000034,height);
  bVar4 = (byte)bits;
  uVar15 = 1 << (bVar4 & 0x1f);
  local_8f8 = (ulong)uVar15;
  uVar13 = (uVar15 + width) - 1 >> (bVar4 & 0x1f);
  uVar15 = (uVar15 + height) - 1;
  uVar19 = uVar15 >> (bVar4 & 0x1f);
  local_8a0 = (ulong)(uint)*percent;
  local_900 = image;
  memset(accumulated_red_histo,0,0x400);
  memset(accumulated_blue_histo,0,0x400);
  uVar16 = 0;
  iVar5 = quality * 7 >> 8;
  local_8d4 = -4;
  if (-4 < iVar5) {
    local_8d4 = iVar5;
  }
  local_8d4 = local_8d4 + 4;
  local_858 = 1;
  if (0x18 < quality) {
    local_858 = (ulong)(0x32 < (uint)quality) * 3 + 4;
  }
  local_8c8 = (long)(int)uVar13;
  local_878 = 0;
  if (0 < (int)uVar13) {
    local_878 = (ulong)uVar13;
  }
  local_898 = 0;
  if (0 < (int)(uVar15 >> (bVar4 & 0x1f))) {
    local_898 = (ulong)uVar19;
  }
  local_8a8 = (long)(width + 2);
  local_850 = (long)width * 4;
  local_8b0 = argb + -(long)width;
  uVar13 = 0;
  uVar15 = 0;
  local_918 = 0;
  local_910 = 0;
  local_90c = 0;
  local_908 = 0;
  local_8e4 = uVar19;
  local_8d8 = quality;
  local_8b8 = argb;
  do {
    iVar5 = (int)local_8d0;
    if (uVar16 == local_898) {
      VP8LOptimizeSampling(local_900,width,iVar5,bits,9,best_bits);
      return 1;
    }
    iVar6 = (int)uVar16 << (bVar4 & 0x1f);
    iVar10 = (int)local_8f8;
    iVar14 = iVar6 + iVar10;
    if (iVar5 <= iVar6 + iVar10) {
      iVar14 = iVar5;
    }
    local_880 = uVar16 * local_8c8;
    local_840 = (long)iVar14;
    iVar14 = iVar14 - iVar6;
    local_888 = (long)iVar6;
    local_8e0 = iVar6 * width;
    local_890 = argb + local_8e0;
    local_8dc = iVar5 - iVar6;
    if (iVar10 < iVar5 - iVar6) {
      local_8dc = iVar10;
    }
    uVar12 = 0;
    local_8c0 = uVar16;
    while (uVar12 != local_878) {
      uVar19 = (int)uVar12 << (bVar4 & 0x1f);
      local_868 = (ulong)uVar19;
      local_904 = uVar19 + (int)local_8f8;
      if (width <= local_904) {
        local_904 = width;
      }
      local_870 = uVar12 + local_880;
      if (local_8c0 != 0) {
        local_908 = local_900[local_870 - local_8c8];
        local_90c = local_908 >> 8;
        local_910 = local_908 >> 0x10;
      }
      prev_x = (VP8LMultipliers)
               ((uint3)(byte)local_918 | (uint3)((uVar15 & 0xff | (uVar13 & 0xff) << 8) << 8));
      prev_y = (VP8LMultipliers)
               ((uint3)local_908 & 0xff |
               (uint3)((local_90c & 0xff) << 8) | (uint3)((local_910 & 0xff) << 0x10));
      iVar10 = local_904 - uVar19;
      local_8f0 = local_890 + (int)uVar19;
      local_860 = uVar12;
      iVar7 = GetPredictionCostCrossColorRed
                        (local_8f0,width,iVar10,iVar14,prev_x,prev_y,0,accumulated_red_histo);
      local_918 = 0;
      for (iVar5 = 0; iVar5 != local_8d4; iVar5 = iVar5 + 1) {
        uVar13 = 0x20 >> ((byte)iVar5 & 0x1f);
        for (iVar6 = -uVar13; uVar16 = local_918, iVar6 <= (int)uVar13; iVar6 = iVar6 + uVar13 * 2)
        {
          uVar15 = iVar6 + (int)local_918;
          iVar8 = GetPredictionCostCrossColorRed
                            (local_8f0,width,iVar10,iVar14,prev_x,prev_y,uVar15,
                             accumulated_red_histo);
          if (iVar8 < iVar7) {
            uVar16 = (ulong)uVar15;
            iVar7 = iVar8;
          }
          local_918 = uVar16;
        }
      }
      iVar7 = GetPredictionCostCrossColorBlue
                        (local_8f0,width,iVar10,iVar14,prev_x,prev_y,0,0,accumulated_blue_histo);
      lVar11 = 0;
      uVar13 = 0;
      uVar15 = 0;
      do {
        if (lVar11 == local_858) goto LAB_0013b297;
        bVar3 = 0x18 < local_8d8;
        cVar2 = (&DAT_001aed00)[lVar11];
        lVar18 = 0;
        local_848 = lVar11;
        do {
          if (lVar18 == 8) break;
          uVar19 = (int)(char)(&DAT_001aecf0)[lVar18 * 2] * (int)cVar2 + uVar15;
          red_to_blue = (int)(char)(&DAT_001aecf1)[lVar18 * 2] * (int)cVar2 + uVar13;
          lVar9 = GetPredictionCostCrossColorBlue
                            (local_8f0,width,iVar10,iVar14,prev_x,prev_y,uVar19,red_to_blue,
                             accumulated_blue_histo);
          if (iVar7 <= lVar9) {
            uVar19 = uVar15;
            lVar9 = iVar7;
            red_to_blue = uVar13;
          }
          uVar13 = red_to_blue;
          iVar7 = lVar9;
          uVar15 = uVar19;
          lVar18 = lVar18 + 1;
        } while (lVar11 != 4 || bVar3);
        lVar11 = local_848 + 1;
      } while (((2 < local_848 - 4U) || (uVar15 != 0)) || (uVar13 != 0));
      uVar13 = 0;
      uVar15 = 0;
LAB_0013b297:
      uVar19 = (uint)local_918 & 0xff | (uVar15 & 0xff | uVar13 << 8) << 8;
      local_900[local_870] = uVar19 | 0xff000000;
      local_91c.red_to_blue = (uint8_t)uVar13;
      local_91c._0_2_ = SUB42(uVar19,0);
      iVar5 = width - (int)local_868;
      if ((int)local_8f8 < iVar5) {
        iVar5 = (int)local_8f8;
      }
      iVar6 = (int)local_868 + local_8e0;
      puVar17 = local_8b8 + iVar6;
      for (iVar10 = local_8dc; lVar11 = local_888, 0 < iVar10; iVar10 = iVar10 + -1) {
        (*VP8LTransformColor)(&local_91c,puVar17,iVar5);
        puVar17 = (uint32_t *)((long)puVar17 + local_850);
      }
      for (; lVar11 < local_840; lVar11 = lVar11 + 1) {
        for (lVar18 = (long)iVar6; lVar18 < (int)lVar11 * width + local_904; lVar18 = lVar18 + 1) {
          uVar19 = local_8b8[lVar18];
          if ((((lVar18 < 2) || (uVar19 != local_8b8[lVar18 + -2])) ||
              (uVar19 != local_8b8[lVar18 + -1])) &&
             (((lVar18 < local_8a8 || (local_8b8[lVar18 + -2] != local_8b0[lVar18 + -2])) ||
              ((local_8b8[lVar18 + -1] != local_8b0[lVar18 + -1] || (uVar19 != local_8b0[lVar18]))))
             )) {
            piVar1 = (int *)((long)accumulated_red_histo + (ulong)(uVar19 >> 0xe & 0x3fc));
            *piVar1 = *piVar1 + 1;
            accumulated_blue_histo[uVar19 & 0xff] = accumulated_blue_histo[uVar19 & 0xff] + 1;
          }
        }
        iVar6 = iVar6 + width;
      }
      argb = local_8b8;
      uVar12 = local_860 + 1;
    }
    iVar5 = WebPReportProgress(pic,((int)local_8c0 * percent_range) / (int)local_8e4 +
                                   (int)local_8a0,percent);
    uVar16 = local_8c0 + 1;
    if (iVar5 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int VP8LColorSpaceTransform(int width, int height, int bits, int quality,
                            uint32_t* const argb, uint32_t* image,
                            const WebPPicture* const pic, int percent_range,
                            int* const percent, int* const best_bits) {
  const int max_tile_size = 1 << bits;
  const int tile_xsize = VP8LSubSampleSize(width, bits);
  const int tile_ysize = VP8LSubSampleSize(height, bits);
  int percent_start = *percent;
  uint32_t accumulated_red_histo[256] = { 0 };
  uint32_t accumulated_blue_histo[256] = { 0 };
  int tile_x, tile_y;
  VP8LMultipliers prev_x, prev_y;
  MultipliersClear(&prev_y);
  MultipliersClear(&prev_x);
  for (tile_y = 0; tile_y < tile_ysize; ++tile_y) {
    for (tile_x = 0; tile_x < tile_xsize; ++tile_x) {
      int y;
      const int tile_x_offset = tile_x * max_tile_size;
      const int tile_y_offset = tile_y * max_tile_size;
      const int all_x_max = GetMin(tile_x_offset + max_tile_size, width);
      const int all_y_max = GetMin(tile_y_offset + max_tile_size, height);
      const int offset = tile_y * tile_xsize + tile_x;
      if (tile_y != 0) {
        ColorCodeToMultipliers(image[offset - tile_xsize], &prev_y);
      }
      prev_x = GetBestColorTransformForTile(tile_x, tile_y, bits,
                                            prev_x, prev_y,
                                            quality, width, height,
                                            accumulated_red_histo,
                                            accumulated_blue_histo,
                                            argb);
      image[offset] = MultipliersToColorCode(&prev_x);
      CopyTileWithColorTransform(width, height, tile_x_offset, tile_y_offset,
                                 max_tile_size, prev_x, argb);

      // Gather accumulated histogram data.
      for (y = tile_y_offset; y < all_y_max; ++y) {
        int ix = y * width + tile_x_offset;
        const int ix_end = ix + all_x_max - tile_x_offset;
        for (; ix < ix_end; ++ix) {
          const uint32_t pix = argb[ix];
          if (ix >= 2 &&
              pix == argb[ix - 2] &&
              pix == argb[ix - 1]) {
            continue;  // repeated pixels are handled by backward references
          }
          if (ix >= width + 2 &&
              argb[ix - 2] == argb[ix - width - 2] &&
              argb[ix - 1] == argb[ix - width - 1] &&
              pix == argb[ix - width]) {
            continue;  // repeated pixels are handled by backward references
          }
          ++accumulated_red_histo[(pix >> 16) & 0xff];
          ++accumulated_blue_histo[(pix >> 0) & 0xff];
        }
      }
    }
    if (!WebPReportProgress(
            pic, percent_start + percent_range * tile_y / tile_ysize,
            percent)) {
      return 0;
    }
  }
  VP8LOptimizeSampling(image, width, height, bits, MAX_TRANSFORM_BITS,
                       best_bits);
  return 1;
}